

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
::emplace<slang::parsing::TokenKind&,slang::parsing::Token&>
          (sherwood_v3_table<std::pair<slang::parsing::TokenKind,slang::parsing::Token>,slang::parsing::TokenKind,std::hash<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::hash<slang::parsing::TokenKind>>,std::equal_to<slang::parsing::TokenKind>,ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,std::pair<slang::parsing::TokenKind,slang::parsing::Token>,std::equal_to<slang::parsing::TokenKind>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,slang::parsing::Token>>,4ul>>
           *this,TokenKind *key,Token *args)

{
  EntryPointer psVar1;
  long lVar2;
  EntryPointer psVar3;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>::templated_iterator<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_bool>
  pVar4;
  
  lVar2 = ((ulong)*key * -0x61c8864680b583eb >> ((byte)this[0x18] & 0x3f)) * 0x20;
  current_entry = (EntryPointer)(*(long *)(this + 8) + lVar2);
  if (*(char *)(*(long *)(this + 8) + lVar2) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar3 = current_entry;
    do {
      if (*key == (psVar3->field_1).value.first) {
        pVar4._8_8_ = 0;
        pVar4.first.current = psVar3;
        return pVar4;
      }
      current_entry = psVar3 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar3 + 1;
      psVar3 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar4 = emplace_new_key<slang::parsing::TokenKind&,slang::parsing::Token&>
                    (this,distance_from_desired,current_entry,key,args);
  return pVar4;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }